

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

int __thiscall
SVGChart::PlotDataContainer::GetPlotIndexByName(PlotDataContainer *this,string *inName)

{
  pointer ppLVar1;
  pointer __s2;
  size_t sVar2;
  LegendData *pLVar3;
  size_t __n;
  bool bVar4;
  int iVar5;
  uint uVar6;
  string *psVar7;
  bool bVar8;
  
  bVar4 = CheckState(this);
  if (bVar4) {
    ppLVar1 = (this->mLegendDataList).
              super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (uint)((ulong)((long)(this->mLegendDataList).
                                 super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1) >> 3);
    bVar4 = 0 < (int)uVar6;
    if (0 < (int)uVar6) {
      __s2 = (inName->_M_dataplus)._M_p;
      sVar2 = inName->_M_string_length;
      psVar7 = (string *)0x0;
      do {
        pLVar3 = ppLVar1[(long)psVar7];
        __n = (pLVar3->mName)._M_string_length;
        if (__n == sVar2) {
          if (__n == 0) {
            bVar8 = true;
          }
          else {
            iVar5 = bcmp((pLVar3->mName)._M_dataplus._M_p,__s2,__n);
            bVar8 = iVar5 == 0;
          }
        }
        else {
          bVar8 = false;
        }
        if (bVar8) {
          inName = psVar7;
        }
        inName = (string *)((ulong)inName & 0xffffffff);
        if (bVar8) break;
        psVar7 = (string *)((long)&(psVar7->_M_dataplus)._M_p + 1);
        bVar4 = psVar7 < (string *)(ulong)(uVar6 & 0x7fffffff);
      } while (psVar7 != (string *)(ulong)(uVar6 & 0x7fffffff));
    }
    if (bVar4) {
      return (int)inName;
    }
  }
  return -1;
}

Assistant:

int PlotDataContainer::GetPlotIndexByName (const string &inName) const {

      if (CheckState ()) {
        for (int theI = 0; theI < int(mLegendDataList.size());theI++) {
          LegendData *theLegendData = mLegendDataList[theI];
          if (theLegendData->mName == inName) {
            return theI;
          }
        }
      }
      return -1;
    }